

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskImageImplementation.hpp
# Opt level: O1

void __thiscall
Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>::~DiskImageHolder
          (DiskImageHolder<Storage::Disk::WOZ> *this)

{
  ~DiskImageHolder(this);
  operator_delete(this,0x638);
  return;
}

Assistant:

DiskImageHolder<T>::~DiskImageHolder() {
	if(update_queue_) update_queue_->flush();
}